

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Utf16ByteLen(void *zIn,int nChar)

{
  byte *pbVar1;
  uint uVar2;
  int local_24;
  int c2;
  int n;
  uchar *z;
  int c;
  int nChar_local;
  void *zIn_local;
  
  _c2 = (byte *)zIn;
  for (local_24 = 0; local_24 < nChar; local_24 = local_24 + 1) {
    uVar2 = (uint)_c2[1] * 0x100 + (uint)*_c2;
    pbVar1 = _c2 + 2;
    if ((0xd7ff < uVar2) && (uVar2 < 0xe000)) {
      pbVar1 = _c2 + 4;
    }
    _c2 = pbVar1;
  }
  return (int)_c2 - (int)zIn;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf16ByteLen(const void *zIn, int nChar){
  int c;
  unsigned char const *z = zIn;
  int n = 0;
  
  if( SQLITE_UTF16NATIVE==SQLITE_UTF16BE ){
    while( n<nChar ){
      READ_UTF16BE(z, 1, c);
      n++;
    }
  }else{
    while( n<nChar ){
      READ_UTF16LE(z, 1, c);
      n++;
    }
  }
  return (int)(z-(unsigned char const *)zIn);
}